

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O0

void M_ParseMenuDefs(void)

{
  bool bVar1;
  uint uVar2;
  undefined1 local_130 [8];
  FScanner sc;
  int IWADMenu;
  FName local_24;
  FName local_20;
  FName local_1c;
  FName local_18;
  FName local_14;
  int local_10;
  int local_c;
  int lastlump;
  int lump;
  
  local_10 = 0;
  FName::FName(&local_14,&gameinfo.mTitleColor);
  OptionSettings.mTitleColor = V_FindFontColor(&local_14);
  FName::FName(&local_18,&gameinfo.mFontColor);
  OptionSettings.mFontColor = V_FindFontColor(&local_18);
  FName::FName(&local_1c,&gameinfo.mFontColorValue);
  OptionSettings.mFontColorValue = V_FindFontColor(&local_1c);
  FName::FName(&local_20,&gameinfo.mFontColorMore);
  OptionSettings.mFontColorMore = V_FindFontColor(&local_20);
  FName::FName(&local_24,&gameinfo.mFontColorHeader);
  OptionSettings.mFontColorHeader = V_FindFontColor(&local_24);
  FName::FName((FName *)&IWADMenu,&gameinfo.mFontColorHighlight);
  OptionSettings.mFontColorHighlight = V_FindFontColor((FName *)&IWADMenu);
  FName::FName((FName *)&sc.CMode,&gameinfo.mFontColorSelection);
  OptionSettings.mFontColorSelection = V_FindFontColor((FName *)&sc.CMode);
  FListMenuDescriptor::Reset(&DefaultListMenuSettings);
  FOptionMenuDescriptor::Reset(&DefaultOptionMenuSettings);
  addterm(DeinitMenus,"DeinitMenus");
  DeinitMenus();
  sc.LastGotLine = FWadCollection::CheckNumForName(&Wads,"MENUDEF",0,1,true);
  while (local_c = FWadCollection::FindLump(&Wads,"MENUDEF",&local_10,false), local_c != -1) {
    FScanner::FScanner((FScanner *)local_130,local_c);
    mustPrintErrors = sc.LastGotLine <= local_c;
    FScanner::SetCMode((FScanner *)local_130,true);
    while (bVar1 = FScanner::GetString((FScanner *)local_130), bVar1) {
      bVar1 = FScanner::Compare((FScanner *)local_130,"LISTMENU");
      if (bVar1) {
        ParseListMenu((FScanner *)local_130);
      }
      else {
        bVar1 = FScanner::Compare((FScanner *)local_130,"DEFAULTLISTMENU");
        if (bVar1) {
          ParseListMenuBody((FScanner *)local_130,&DefaultListMenuSettings);
          uVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                            (&DefaultListMenuSettings.mItems.
                              super_TArray<FListMenuItem_*,_FListMenuItem_*>);
          if (uVar2 != 0) {
            I_FatalError("You cannot add menu items to the menu default settings.");
          }
        }
        else {
          bVar1 = FScanner::Compare((FScanner *)local_130,"OPTIONVALUE");
          if (bVar1) {
            ParseOptionValue((FScanner *)local_130);
          }
          else {
            bVar1 = FScanner::Compare((FScanner *)local_130,"OPTIONSTRING");
            if (bVar1) {
              ParseOptionString((FScanner *)local_130);
            }
            else {
              bVar1 = FScanner::Compare((FScanner *)local_130,"OPTIONMENUSETTINGS");
              if (bVar1) {
                ParseOptionSettings((FScanner *)local_130);
              }
              else {
                bVar1 = FScanner::Compare((FScanner *)local_130,"OPTIONMENU");
                if (bVar1) {
                  ParseOptionMenu((FScanner *)local_130);
                }
                else {
                  bVar1 = FScanner::Compare((FScanner *)local_130,"DEFAULTOPTIONMENU");
                  if (bVar1) {
                    ParseOptionMenuBody((FScanner *)local_130,&DefaultOptionMenuSettings);
                    uVar2 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                                      (&DefaultOptionMenuSettings.mItems.
                                        super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
                    if (uVar2 != 0) {
                      I_FatalError("You cannot add menu items to the menu default settings.");
                    }
                  }
                  else {
                    FScanner::ScriptError((FScanner *)local_130,"Unknown keyword \'%s\'",local_130);
                  }
                }
              }
            }
          }
        }
      }
    }
    FScanner::~FScanner((FScanner *)local_130);
  }
  return;
}

Assistant:

void M_ParseMenuDefs()
{
	int lump, lastlump = 0;

	OptionSettings.mTitleColor = V_FindFontColor(gameinfo.mTitleColor);
	OptionSettings.mFontColor = V_FindFontColor(gameinfo.mFontColor);
	OptionSettings.mFontColorValue = V_FindFontColor(gameinfo.mFontColorValue);
	OptionSettings.mFontColorMore = V_FindFontColor(gameinfo.mFontColorMore);
	OptionSettings.mFontColorHeader = V_FindFontColor(gameinfo.mFontColorHeader);
	OptionSettings.mFontColorHighlight = V_FindFontColor(gameinfo.mFontColorHighlight);
	OptionSettings.mFontColorSelection = V_FindFontColor(gameinfo.mFontColorSelection);
	DefaultListMenuSettings.Reset();
	DefaultOptionMenuSettings.Reset();

	atterm(	DeinitMenus);
	DeinitMenus();

	int IWADMenu = Wads.CheckNumForName("MENUDEF", ns_global, FWadCollection::IWAD_FILENUM);

	while ((lump = Wads.FindLump ("MENUDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);

		mustPrintErrors = lump >= IWADMenu;
		sc.SetCMode(true);
		while (sc.GetString())
		{
			if (sc.Compare("LISTMENU"))
			{
				ParseListMenu(sc);
			}
			else if (sc.Compare("DEFAULTLISTMENU"))
			{
				ParseListMenuBody(sc, &DefaultListMenuSettings);
				if (DefaultListMenuSettings.mItems.Size() > 0)
				{
					I_FatalError("You cannot add menu items to the menu default settings.");
				}
			}
			else if (sc.Compare("OPTIONVALUE"))
			{
				ParseOptionValue(sc);
			}
			else if (sc.Compare("OPTIONSTRING"))
			{
				ParseOptionString(sc);
			}
			else if (sc.Compare("OPTIONMENUSETTINGS"))
			{
				ParseOptionSettings(sc);
			}
			else if (sc.Compare("OPTIONMENU"))
			{
				ParseOptionMenu(sc);
			}
			else if (sc.Compare("DEFAULTOPTIONMENU"))
			{
				ParseOptionMenuBody(sc, &DefaultOptionMenuSettings);
				if (DefaultOptionMenuSettings.mItems.Size() > 0)
				{
					I_FatalError("You cannot add menu items to the menu default settings.");
				}
			}
			else
			{
				sc.ScriptError("Unknown keyword '%s'", sc.String);
			}
		}
	}
}